

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::indexStructBufferContent
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *buffer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TTypeList *pTVar3;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar4;
  
  if (buffer != (TIntermTyped *)0x0) {
    iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])(buffer);
    bVar1 = isStructBufferType(this,(TType *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])(buffer);
      pTVar3 = TType::getStruct((TType *)CONCAT44(extraout_var_00,iVar2));
      index = TIntermediate::addConstantUnion
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (int)((ulong)((long)(pTVar3->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar3->
                                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                            ).
                                            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1,loc
                         ,false);
      pTVar4 = TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpIndexDirectStruct,buffer,&index->super_TIntermTyped,loc);
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x1d])
                (pTVar4,(pTVar3->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].type);
      return pTVar4;
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::indexStructBufferContent(const TSourceLoc& loc, TIntermTyped* buffer) const
{
    // Bail out if not a struct buffer
    if (buffer == nullptr || ! isStructBufferType(buffer->getType()))
        return nullptr;

    // Runtime sized array is always the last element.
    const TTypeList* bufferStruct = buffer->getType().getStruct();
    TIntermTyped* arrayPosition = intermediate.addConstantUnion(unsigned(bufferStruct->size()-1), loc);

    TIntermTyped* argArray = intermediate.addIndex(EOpIndexDirectStruct, buffer, arrayPosition, loc);
    argArray->setType(*(*bufferStruct)[bufferStruct->size()-1].type);

    return argArray;
}